

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  Curl_easy *data_00;
  curltime cVar1;
  undefined4 uStack_144;
  Curl_hash_element *local_140;
  Curl_hash_element *he;
  Curl_hash_iterator iter;
  Curl_sh_entry *entry;
  Curl_llist_node *e;
  undefined4 uStack_104;
  undefined1 local_100 [8];
  multi_run_ctx mrc;
  Curl_easy *data;
  CURLMcode result;
  int *running_handles_local;
  int ev_bitmask_local;
  curl_socket_t s_local;
  _Bool checkall_local;
  Curl_multi *multi_local;
  
  mrc.run_cpool = false;
  mrc._193_7_ = 0;
  memset(local_100,0,200);
  local_100 = (undefined1  [8])multi;
  cVar1 = Curl_now();
  mrc.multi = (Curl_multi *)cVar1.tv_sec;
  mrc.now.tv_sec = CONCAT44(uStack_104,cVar1.tv_usec);
  sigpipe_init((sigpipe_ignore *)&mrc.run_xfers);
  if (checkall) {
    data._4_4_ = curl_multi_perform(multi,running_handles);
    if (data._4_4_ != CURLM_BAD_HANDLE) {
      for (entry = (Curl_sh_entry *)Curl_llist_head(&multi->process);
          entry != (Curl_sh_entry *)0x0 && data._4_4_ == CURLM_OK;
          entry = (Curl_sh_entry *)Curl_node_next((Curl_llist_node *)entry)) {
        data_00 = (Curl_easy *)Curl_node_elem((Curl_llist_node *)entry);
        data._4_4_ = singlesocket(multi,data_00);
      }
    }
    mrc.pipe_st.no_signal = true;
  }
  else {
    if (s != -1) {
      iter.current_element = (Curl_llist_node *)sh_getentry(&multi->sockhash,s);
      if ((Curl_sh_entry *)iter.current_element == (Curl_sh_entry *)0x0) {
        Curl_cpool_multi_socket(multi,s,ev_bitmask);
      }
      else {
        Curl_hash_start_iterate((Curl_hash *)iter.current_element,(Curl_hash_iterator *)&he);
        local_140 = Curl_hash_next_element((Curl_hash_iterator *)&he);
        while (local_140 != (Curl_hash_element *)0x0) {
          mrc._192_8_ = local_140->ptr;
          if ((Curl_easy *)mrc._192_8_ == (multi->cpool).idata) {
            mrc.pipe_st.no_signal = true;
          }
          else {
            Curl_expire_ex((Curl_easy *)mrc._192_8_,(curltime *)&mrc,0,EXPIRE_RUN_NOW);
          }
          local_140 = Curl_hash_next_element((Curl_hash_iterator *)&he);
        }
      }
    }
    data._4_4_ = multi_run_expired((multi_run_ctx *)local_100);
    if ((data._4_4_ == CURLM_OK) && (mrc.now._8_8_ != 0)) {
      cVar1 = Curl_now();
      mrc.multi = (Curl_multi *)cVar1.tv_sec;
      mrc.now.tv_sec = CONCAT44(uStack_144,cVar1.tv_usec);
      data._4_4_ = multi_run_expired((multi_run_ctx *)local_100);
    }
  }
  if ((mrc.pipe_st.no_signal & 1U) != 0) {
    sigpipe_apply((multi->cpool).idata,(sigpipe_ignore *)&mrc.run_xfers);
    Curl_cpool_multi_perform(multi);
  }
  sigpipe_restore((sigpipe_ignore *)&mrc.run_xfers);
  if (running_handles != (int *)0x0) {
    *running_handles = multi->num_alive;
  }
  if (data._4_4_ < CURLM_BAD_HANDLE) {
    data._4_4_ = Curl_update_timer(multi);
  }
  return data._4_4_;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct multi_run_ctx mrc;

  (void)ev_bitmask;
  memset(&mrc, 0, sizeof(mrc));
  mrc.multi = multi;
  mrc.now = Curl_now();
  sigpipe_init(&mrc.pipe_st);

  if(checkall) {
    struct Curl_llist_node *e;
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      for(e = Curl_llist_head(&multi->process); e && !result;
          e = Curl_node_next(e)) {
        result = singlesocket(multi, Curl_node_elem(e));
      }
    }
    mrc.run_cpool = TRUE;
    goto out;
  }

  if(s != CURL_SOCKET_TIMEOUT) {
    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry) {
      /* Unmatched socket, we cannot act on it but we ignore this fact. In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      /* The socket might come from a connection that is being shut down
       * by the multi's connection pool. */
      Curl_cpool_multi_socket(multi, s, ev_bitmask);
    }
    else {
      struct Curl_hash_iterator iter;
      struct Curl_hash_element *he;

      /* the socket can be shared by many transfers, iterate */
      Curl_hash_start_iterate(&entry->transfers, &iter);
      for(he = Curl_hash_next_element(&iter); he;
          he = Curl_hash_next_element(&iter)) {
        data = (struct Curl_easy *)he->ptr;
        DEBUGASSERT(data);
        DEBUGASSERT(data->magic == CURLEASY_MAGIC_NUMBER);

        if(data == multi->cpool.idata)
          mrc.run_cpool = TRUE;
        else {
          /* Expire with out current now, so we will get it below when
           * asking the splaytree for expired transfers. */
          Curl_expire_ex(data, &mrc.now, 0, EXPIRE_RUN_NOW);
        }
      }
    }
  }

  result = multi_run_expired(&mrc);
  if(result)
    goto out;

  if(mrc.run_xfers) {
    /* Running transfers takes time. With a new timestamp, we might catch
     * other expires which are due now. Instead of telling the application
     * to set a 0 timeout and call us again, we run them here.
     * Do that only once or it might be unfair to transfers on other
     * sockets. */
    mrc.now = Curl_now();
    result = multi_run_expired(&mrc);
  }

out:
  if(mrc.run_cpool) {
    sigpipe_apply(multi->cpool.idata, &mrc.pipe_st);
    Curl_cpool_multi_perform(multi);
  }
  sigpipe_restore(&mrc.pipe_st);

  if(running_handles)
    *running_handles = (int)multi->num_alive;

  if(CURLM_OK >= result)
    result = Curl_update_timer(multi);
  return result;
}